

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O3

int Tas_ManSolveArray(Tas_Man_t *p,Vec_Ptr_t *vObjs)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int *piVar5;
  float *pfVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  
  s_Counter2 = 0;
  s_Counter3 = 0;
  s_Counter4 = 0;
  p->vModel->nSize = 0;
  iVar7 = vObjs->nSize;
  uVar9 = (ulong)iVar7;
  if (0 < (long)uVar9) {
    uVar10 = 0;
    do {
      if ((Gia_Obj_t *)vObjs->pArray[uVar10] == p->pAig->pObjs) {
        return 1;
      }
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                  ,0x59a,"int Tas_ManSolveArray(Tas_Man_t *, Vec_Ptr_t *)");
  }
  if (((p->pJust).iHead != 0) || ((p->pJust).iTail != 0)) {
    __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                  ,0x59b,"int Tas_ManSolveArray(Tas_Man_t *, Vec_Ptr_t *)");
  }
  if (((p->pClauses).iHead != 1) || ((p->pClauses).iTail != 1)) {
    __assert_fail("p->pClauses.iHead == 1 && p->pClauses.iTail == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                  ,0x59c,"int Tas_ManSolveArray(Tas_Man_t *, Vec_Ptr_t *)");
  }
  (p->Pars).nJustThis = 0;
  (p->Pars).nBTThis = 0;
  (p->Pars).nBTThisNc = 0;
  if (0 < iVar7) {
    lVar12 = 0;
    do {
      pGVar2 = (Gia_Obj_t *)vObjs->pArray[lVar12];
      if ((pGVar2 != (Gia_Obj_t *)((ulong)p->pAig->pObjs ^ 1)) &&
         ((*(byte *)(((ulong)pGVar2 & 0xfffffffffffffffe) + 3) & 0x40) == 0)) {
        Tas_ManAssign(p,pGVar2,0,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
        uVar9 = (ulong)(uint)vObjs->nSize;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)uVar9);
  }
  iVar7 = Tas_ManSolve_rec(p,0);
  iVar11 = 1;
  if (((iVar7 == 0) && ((p->Pars).nJustThis <= (p->Pars).nJustLimit)) &&
     ((p->Pars).nBTThis <= (p->Pars).nBTLimit)) {
    pVVar3 = p->vModel;
    iVar11 = 0;
    pVVar3->nSize = 0;
    (p->pProp).iHead = 0;
    iVar7 = (p->pProp).iTail;
    if (iVar7 < 1) goto LAB_00725575;
    iVar11 = 0;
    lVar12 = 0;
    do {
      pGVar2 = (p->pProp).pData[lVar12];
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar9 = *(ulong *)pGVar2;
      if ((~(uint)uVar9 & 0x9fffffff) == 0) {
        if (((uint)uVar9 >> 0x1e & 1) == 0) {
          __assert_fail("pVar->fMark0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                        ,0x78,"int Tas_VarValue(Gia_Obj_t *)");
        }
        Vec_IntPush(pVVar3,((uint)(uVar9 >> 0x1f) & 0x3ffffffe | (uint)(uVar9 >> 0x3e) & 1) ^ 1);
        iVar7 = (p->pProp).iTail;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar7);
  }
  iVar7 = (p->pProp).iTail;
LAB_00725575:
  if (iVar7 < 0) {
    __assert_fail("iBound <= p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                  ,0x277,"void Tas_ManCancelUntil(Tas_Man_t *, int)");
  }
  (p->pProp).iHead = 0;
  if (iVar7 != 0) {
    lVar12 = 0;
    do {
      pGVar2 = (p->pProp).pData[lVar12];
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      if (((uint)*(ulong *)pGVar2 >> 0x1e & 1) == 0) {
        __assert_fail("pVar->fMark0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                      ,0x77,"void Tas_VarUnassign(Gia_Obj_t *)");
      }
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xbfffffffbfffffff;
      pGVar2->Value = 0xffffffff;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (p->pProp).iTail);
  }
  (p->pProp).iTail = 0;
  if (-1 < p->vLevReas->nSize) {
    p->vLevReas->nSize = 0;
    (p->pJust).iHead = 0;
    (p->pJust).iTail = 0;
    (p->pClauses).iHead = 1;
    (p->pClauses).iTail = 1;
    if (0 < p->nClauses) {
      (p->pStore).iCur = 0x10;
      pVVar3 = p->vWatchLits;
      if (0 < pVVar3->nSize) {
        piVar4 = pVVar3->pArray;
        piVar5 = p->pWatches;
        lVar12 = 0;
        do {
          piVar5[piVar4[lVar12]] = 0;
          lVar12 = lVar12 + 1;
        } while (lVar12 < pVVar3->nSize);
      }
      pVVar3->nSize = 0;
      p->nClauses = 0;
    }
    pVVar3 = p->vActiveVars;
    iVar7 = pVVar3->nSize;
    if (0 < (long)iVar7) {
      piVar4 = pVVar3->pArray;
      pfVar6 = p->pActivity;
      lVar12 = 0;
      do {
        pfVar6[piVar4[lVar12]] = 0.0;
        lVar12 = lVar12 + 1;
      } while (iVar7 != lVar12);
    }
    pVVar3->nSize = 0;
    iVar7 = (p->Pars).nBTThis;
    iVar1 = (p->Pars).nJustThis;
    piVar4 = &(p->Pars).nBTTotal;
    *piVar4 = *piVar4 + iVar7;
    iVar8 = (p->Pars).nJustTotal;
    if (iVar8 <= iVar1) {
      iVar8 = iVar1;
    }
    (p->Pars).nJustTotal = iVar8;
    iVar8 = -1;
    if ((iVar1 <= (p->Pars).nJustLimit) && (iVar8 = -1, iVar7 <= (p->Pars).nBTLimit)) {
      iVar8 = iVar11;
    }
    return iVar8;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

int Tas_ManSolveArray( Tas_Man_t * p, Vec_Ptr_t * vObjs )
{
    Gia_Obj_t * pObj;
    int i, Entry, RetValue = 0;
    s_Counter2 = 0;
    s_Counter3 = 0;
    s_Counter4 = 0;
    Vec_IntClear( p->vModel );
    Vec_PtrForEachEntry( Gia_Obj_t *, vObjs, pObj, i )
        if ( pObj == Gia_ManConst0(p->pAig) )
            return 1;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    assert( p->pClauses.iHead == 1 && p->pClauses.iTail == 1 );
    p->Pars.nBTThis = p->Pars.nJustThis = p->Pars.nBTThisNc = 0;
    Vec_PtrForEachEntry( Gia_Obj_t *, vObjs, pObj, i )
        if ( pObj != Gia_ManConst1(p->pAig) && !Tas_VarIsAssigned(Gia_Regular(pObj)) )
            Tas_ManAssign( p, pObj, 0, NULL, NULL );
    if ( !Tas_ManSolve_rec(p, 0) && !Tas_ManCheckLimits(p) )
        Tas_ManSaveModel( p, p->vModel );
    else
        RetValue = 1;
    Tas_ManCancelUntil( p, 0 );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->pClauses.iHead = p->pClauses.iTail = 1;
    // clauses
    if ( p->nClauses > 0 )
    {
        p->pStore.iCur = 16;
        Vec_IntForEachEntry( p->vWatchLits, Entry, i )
            p->pWatches[Entry] = 0;
        Vec_IntClear( p->vWatchLits );
        p->nClauses = 0;
    }
    // activity
    Vec_IntForEachEntry( p->vActiveVars, Entry, i )
        p->pActivity[Entry] = 0.0;
    Vec_IntClear( p->vActiveVars );
    // statistics
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Tas_ManCheckLimits( p ) )
        RetValue = -1;

//    printf( "%d ", Gia_ManObjNum(p->pAig) );
//    printf( "%d ", p->Pars.nBTThis );
//    printf( "%d ", p->Pars.nJustThis );
//    printf( "%d ", s_Counter2 );
//    printf( "%d ", s_Counter3 );
//    printf( "%d  ", s_Counter4 );
    return RetValue;
}